

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientImpl.cpp
# Opt level: O2

void SL::WS_LITE::
     ConnectHandshake<std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>const>
               (shared_ptr<SL::WS_LITE::HubContext> *self,
               shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
               *socket,string *host,string *endpoint,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *extraheaders)

{
  element_type *peVar1;
  result_type rVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ascii;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  int c;
  long lVar4;
  __node_base *p_Var5;
  shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> write_buffer;
  uniform_int_distribution<unsigned_int> dist;
  string nonce;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nonce_base64;
  undefined1 local_1538 [48];
  __shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_1508;
  __shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2> local_14f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> accept_sha1;
  ostream request;
  ios_base local_14c0 [264];
  random_device rd;
  
  std::make_shared<asio::basic_streambuf<std::allocator<char>>>();
  std::ostream::ostream
            (&request,&(write_buffer.
                        super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super_streambuf);
  poVar3 = std::operator<<(&request,"GET ");
  poVar3 = std::operator<<(poVar3,(string *)endpoint);
  std::operator<<(poVar3," HTTP/1.1\r\n");
  poVar3 = std::operator<<(&request,"Host:");
  poVar3 = std::operator<<(poVar3,(string *)host);
  std::operator<<(poVar3,"\r\n");
  std::operator<<(&request,"Upgrade: websocket\r\n");
  std::operator<<(&request,"Connection: Upgrade\r\n");
  nonce._M_dataplus._M_p = (pointer)&nonce.field_2;
  nonce._M_string_length = 0;
  nonce.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)&nonce);
  dist._M_param._M_a = 0;
  dist._M_param._M_b = 0xff;
  std::random_device::random_device(&rd);
  ascii = extraout_RDX;
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()(&dist,&rd);
    nonce._M_dataplus._M_p[lVar4] = (char)rVar2;
    ascii = extraout_RDX_00;
  }
  Base64encode<std::__cxx11::string>(&nonce_base64,(WS_LITE *)&nonce,ascii);
  poVar3 = std::operator<<(&request,"Sec-WebSocket-Key:");
  poVar3 = std::operator<<(poVar3,(string *)&nonce_base64);
  std::operator<<(poVar3,"\r\n");
  std::operator<<(&request,"Sec-WebSocket-Version: 13\r\n");
  p_Var5 = &(extraheaders->_M_h)._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    poVar3 = std::operator<<(&request,(string *)(p_Var5 + 1));
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = std::operator<<(poVar3,(string *)(p_Var5 + 5));
    std::operator<<(poVar3,"\r\n");
  }
  std::operator<<(&request,"\r\n");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1538,
                 &nonce_base64,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ws_magic_string_abi_cxx11_);
  SHA1<std::__cxx11::string>(&accept_sha1,(WS_LITE *)local_1538,input);
  std::__cxx11::string::~string((string *)local_1538);
  peVar1 = (socket->
           super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  std::__shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                *)local_1538,
               &write_buffer.
                super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              );
  std::__cxx11::string::string((string *)(local_1538 + 0x10),(string *)&accept_sha1);
  std::
  __shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_1508,
                 &socket->
                  super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  std::__shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_14f8,
             &self->super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>);
  asio::
  async_write<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>,std::allocator<char>,SL::WS_LITE::ConnectHandshake<std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>const>(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::_lambda(std::error_code_const&,unsigned_long)_1_>
            (&peVar1->Socket,
             write_buffer.
             super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,(type_conflict *)local_1538);
  ConnectHandshake<std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>const>(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
  ::{lambda(std::error_code_const&,unsigned_long)#1}::~error_code
            ((_lambda_std__error_code_const__unsigned_long__1_ *)local_1538);
  std::__cxx11::string::~string((string *)&accept_sha1);
  std::__cxx11::string::~string((string *)&nonce_base64);
  std::random_device::~random_device(&rd);
  std::__cxx11::string::~string((string *)&nonce);
  std::ios_base::~ios_base(local_14c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&write_buffer.
              super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void ConnectHandshake(const std::shared_ptr<HubContext> self, SOCKETTYPE &socket, const std::string &host, const std::string &endpoint,
                          const std::unordered_map<std::string, std::string> &extraheaders)
    {
        auto write_buffer(std::make_shared<asio::streambuf>());
        std::ostream request(write_buffer.get());

        request << "GET " << endpoint << " HTTP/1.1\r\n";
        request << "Host:" << host << "\r\n";
        request << "Upgrade: websocket\r\n";
        request << "Connection: Upgrade\r\n";

        // Make random 16-byte nonce
        std::string nonce;
        nonce.resize(16);
        std::uniform_int_distribution<unsigned int> dist(0, 255);
        std::random_device rd;
        for (int c = 0; c < 16; c++) {
            nonce[c] = static_cast<unsigned char>(dist(rd));
        }

        auto nonce_base64 = Base64encode(nonce);
        request << "Sec-WebSocket-Key:" << nonce_base64 << "\r\n";
        request << "Sec-WebSocket-Version: 13\r\n";
        for (auto &h : extraheaders) {
            request << h.first << ":" << h.second << "\r\n";
        }
        //  request << "" << HTTP_ENDLINE;
        //  request << HTTP_SECWEBSOCKETEXTENSIONS << HTTP_KEYVALUEDELIM << PERMESSAGEDEFLATE << HTTP_ENDLINE;
        request << "\r\n";

        auto accept_sha1 = SHA1(nonce_base64 + ws_magic_string);

        asio::async_write(
            socket->Socket, *write_buffer, [write_buffer, accept_sha1, socket, self](const std::error_code &ec, size_t bytes_transferred) {
                UNUSED(bytes_transferred);
                if (!ec) {
                    SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "Sent Handshake bytes " << bytes_transferred);
                    auto read_buffer(std::make_shared<asio::streambuf>());
                    asio::async_read_until(socket->Socket, *read_buffer, "\r\n\r\n",
                                           [read_buffer, accept_sha1, socket, self](const std::error_code &ec, size_t bytes_transferred) {
                                               UNUSED(bytes_transferred);
                                               if (!ec) {
                                                   SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "Read Handshake bytes " << bytes_transferred
                                                                                                                          << "  sizeof read_buffer "
                                                                                                                          << read_buffer->size());

                                                   auto header = ParseHeader(asio::buffer_cast<const char *>(read_buffer->data()));
                                                   auto sockey = std::find_if(std::begin(header.Values), std::end(header.Values),
                                                                              [](HeaderKeyValue k) { return k.Key == "Sec-WebSocket-Accept"; });

                                                   if (sockey == std::end(header.Values)) {
                                                       return;
                                                   }
                                                   if (Base64decode(sockey->Value) == accept_sha1) {

                                                       SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "Connected ");

                                                       socket->SocketStatus_ = SocketStatus::CONNECTED;
                                                       start_ping<false>(socket, std::chrono::seconds(5));
                                                       if (socket->Parent->onConnection) {
                                                           socket->Parent->onConnection(socket, header);
                                                       }
                                                       ReadHeaderStart<false>(socket, read_buffer);
                                                   }
                                                   else {
                                                       socket->SocketStatus_ = SocketStatus::CLOSED;
                                                       SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "WebSocket handshake failed  ");
                                                       if (socket->Parent->onDisconnection) {
                                                           socket->Parent->onDisconnection(socket, 1002, "WebSocket handshake failed  ");
                                                       }
                                                   }
                                               }
                                               else {
                                                   socket->SocketStatus_ = SocketStatus::CLOSED;
                                                   SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "async_read_until failed  " << ec.message());
                                                   if (socket->Parent->onDisconnection) {
                                                       socket->Parent->onDisconnection(socket, 1002, "async_read_until failed  " + ec.message());
                                                   }
                                               }
                                           });
                }
                else {
                    socket->SocketStatus_ = SocketStatus::CLOSED;
                    SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "Failed sending handshake" << ec.message());
                    if (socket->Parent->onDisconnection) {
                        socket->Parent->onDisconnection(socket, 1002, "Failed sending handshake" + ec.message());
                    }
                }
            });
    }